

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PortSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,bool>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,bool *args_2)

{
  bool bVar1;
  SourceLocation SVar2;
  size_t sVar3;
  char *pcVar4;
  PortSymbol *pPVar5;
  
  pPVar5 = (PortSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PortSymbol *)this->endPtr < pPVar5 + 1) {
    pPVar5 = (PortSymbol *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pPVar5 + 1);
  }
  sVar3 = args->_M_len;
  pcVar4 = args->_M_str;
  SVar2 = *args_1;
  bVar1 = *args_2;
  (pPVar5->super_Symbol).kind = Port;
  (pPVar5->super_Symbol).name._M_len = sVar3;
  (pPVar5->super_Symbol).name._M_str = pcVar4;
  (pPVar5->super_Symbol).location = SVar2;
  (pPVar5->super_Symbol).parentScope = (Scope *)0x0;
  (pPVar5->super_Symbol).nextInScope = (Symbol *)0x0;
  (pPVar5->super_Symbol).indexInScope = 0;
  (pPVar5->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  pPVar5->internalSymbol = (Symbol *)0x0;
  pPVar5->direction = InOut;
  pPVar5->isNullPort = false;
  pPVar5->isAnsiPort = bVar1;
  pPVar5->type = (Type *)0x0;
  pPVar5->initializer = (Expression *)0x0;
  pPVar5->internalExpr = (Expression *)0x0;
  pPVar5->initializerSyntax = (ExpressionSyntax *)0x0;
  pPVar5->initializerLoc = (SourceLocation)0x0;
  pPVar5->externalLoc = SVar2;
  return pPVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }